

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O0

Page * __thiscall sf::Font::loadPage(Font *this,uint characterSize)

{
  bool bVar1;
  pointer ppVar2;
  map<unsigned_int,_sf::Font::Page,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
  *this_00;
  undefined1 uVar3;
  long in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_int,_Page>_>::value,_pair<iterator,_bool>_>
  _Var4;
  iterator pageIterator;
  map<unsigned_int,_sf::Font::Page,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
  *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  pair<unsigned_int,_sf::Font::Page> *in_stack_fffffffffffffe98;
  undefined1 in_stack_ffffffffffffff0f;
  Page *in_stack_ffffffffffffff10;
  _Self local_20;
  _Self local_18 [3];
  
  local_18[0]._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_sf::Font::Page,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
       ::find(in_stack_fffffffffffffe88,(key_type *)0x1df044);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_sf::Font::Page,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
       ::end(in_stack_fffffffffffffe88);
  bVar1 = std::operator==(local_18,&local_20);
  if (bVar1) {
    this_00 = (map<unsigned_int,_sf::Font::Page,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
               *)(in_RDI + 0x50);
    Page::Page(in_stack_ffffffffffffff10,(bool)in_stack_ffffffffffffff0f);
    std::make_pair<unsigned_int&,sf::Font::Page>
              (&in_stack_fffffffffffffe98->first,
               (Page *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
    _Var4 = std::
            map<unsigned_int,sf::Font::Page,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,sf::Font::Page>>>
            ::insert<std::pair<unsigned_int,sf::Font::Page>>(this_00,in_stack_fffffffffffffe98);
    local_18[0]._M_node = (_Base_ptr)_Var4.first._M_node;
    uVar3 = _Var4.second;
    std::pair<unsigned_int,_sf::Font::Page>::~pair((pair<unsigned_int,_sf::Font::Page> *)0x1df127);
    Page::~Page((Page *)CONCAT17(uVar3,in_stack_fffffffffffffe90));
  }
  ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_sf::Font::Page>_>::operator->
                     ((_Rb_tree_iterator<std::pair<const_unsigned_int,_sf::Font::Page>_> *)0x1df177)
  ;
  return &ppVar2->second;
}

Assistant:

Font::Page& Font::loadPage(unsigned int characterSize) const
{
    // TODO: Remove this method and use try_emplace instead when updating to C++17
    PageTable::iterator pageIterator = m_pages.find(characterSize);
    if (pageIterator == m_pages.end())
        pageIterator = m_pages.insert(std::make_pair(characterSize, Page(m_isSmooth))).first;

    return pageIterator->second;
}